

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr,int op)

{
  Expr *pEStack_30;
  int op_local;
  Expr *pExpr_local;
  int *aiCurCol_local;
  Bitmask mPrereq_local;
  SrcList *pFrom_local;
  
  pEStack_30 = pExpr;
  if (((pExpr->op == 0xa9) && (0x35 < op)) && (op < 0x3a)) {
    pEStack_30 = ((pExpr->x).pList)->a[0].pExpr;
  }
  if (pEStack_30->op == 0xa2) {
    *aiCurCol = pEStack_30->iTable;
    aiCurCol[1] = (int)pEStack_30->iColumn;
    pFrom_local._4_4_ = 1;
  }
  else if (mPrereq == 0) {
    pFrom_local._4_4_ = 0;
  }
  else if ((mPrereq & mPrereq - 1) == 0) {
    pFrom_local._4_4_ = exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pEStack_30);
  }
  else {
    pFrom_local._4_4_ = 0;
  }
  return pFrom_local._4_4_;
}

Assistant:

static int exprMightBeIndexed(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor & column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int op                 /* The specific comparison operator */
){
  /* If this expression is a vector to the left or right of a 
  ** inequality constraint (>, <, >= or <=), perform the processing 
  ** on the first element of the vector.  */
  assert( TK_GT+1==TK_LE && TK_GT+2==TK_LT && TK_GT+3==TK_GE );
  assert( TK_IS<TK_GE && TK_ISNULL<TK_GE && TK_IN<TK_GE );
  assert( op<=TK_GE );
  if( pExpr->op==TK_VECTOR && (op>=TK_GT && ALWAYS(op<=TK_GE)) ){
    pExpr = pExpr->x.pList->a[0].pExpr;
  }

  if( pExpr->op==TK_COLUMN ){
    aiCurCol[0] = pExpr->iTable;
    aiCurCol[1] = pExpr->iColumn;
    return 1;
  }
  if( mPrereq==0 ) return 0;                 /* No table references */
  if( (mPrereq&(mPrereq-1))!=0 ) return 0;   /* Refs more than one table */
  return exprMightBeIndexed2(pFrom,mPrereq,aiCurCol,pExpr);
}